

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::Clear
          (BayesianProbitRegressor_FeatureWeight *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::TypeHandler>
            (&(this->weights_).super_RepeatedPtrFieldBase);
  this->featureid_ = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureWeight::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  weights_.Clear();
  featureid_ = 0u;
  _internal_metadata_.Clear<std::string>();
}